

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  byte bVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  undefined8 in_RAX;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  size_t sVar7;
  undefined7 in_register_00000009;
  size_t len_00;
  bool bVar8;
  char *__s;
  char out [3];
  undefined8 uStack_38;
  
  pbVar5 = (byte *)url;
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,relative) == 0) {
    pcVar4 = strstr(url,"//");
    __s = pcVar4 + 2;
    if (pcVar4 == (char *)0x0) {
      __s = url;
    }
    pbVar5 = (byte *)strchr(__s,0x3f);
    pbVar6 = (byte *)strchr(__s,0x2f);
    if (pbVar6 == (byte *)0x0) {
      sVar7 = strlen(url);
      pbVar6 = (byte *)(url + sVar7);
    }
    if (pbVar5 == (byte *)0x0) {
      sVar7 = strlen(url);
      pbVar5 = (byte *)(url + sVar7);
    }
    if (pbVar6 < pbVar5) {
      pbVar5 = pbVar6;
    }
  }
  if (len != 0) {
    bVar8 = !query;
    do {
      uVar2 = uStack_38;
      if (url < pbVar5) {
LAB_00164f50:
        len_00 = 1;
        pbVar6 = (byte *)url;
      }
      else {
        bVar1 = *url;
        if (bVar1 == 0x3f) {
          bVar8 = false;
LAB_00164f31:
          if ((((bVar1 < 0x20) || (bVar1 == 0x20)) || (bVar1 == 0x7f)) ||
             (bVar1 != 0x20 && bVar1 < 0x7f)) goto LAB_00164f50;
          uStack_38._0_6_ = CONCAT24(0x25,(undefined4)uStack_38);
          uStack_38._0_6_ = CONCAT15("0123456789abcdef"[bVar1 >> 4],(undefined5)uStack_38);
          uStack_38._7_1_ = SUB81(uVar2,7);
          uStack_38._0_7_ = CONCAT16("0123456789abcdef"[bVar1 & 0xf],(undefined6)uStack_38);
          len_00 = 3;
          pbVar6 = (byte *)((long)&uStack_38 + 4);
        }
        else {
          if (bVar1 != 0x20) goto LAB_00164f31;
          if (bVar8) {
            len_00 = 3;
            pbVar6 = (byte *)"%20";
          }
          else {
            len_00 = 1;
            pbVar6 = (byte *)"+";
          }
        }
      }
      CVar3 = Curl_dyn_addn(o,pbVar6,len_00);
      if (CVar3 != CURLE_OK) {
        if (CVar3 != CURLE_TOO_LARGE) {
          return CURLUE_OUT_OF_MEMORY;
        }
        return CURLUE_TOO_LARGE;
      }
      url = (char *)((byte *)url + 1);
      len = len - 1;
    } while (len != 0);
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      len; iptr++, len--) {

    if(iptr < host_sep) {
      result = Curl_dyn_addn(o, iptr, 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == '?')
      left = FALSE;

    if(urlchar_needs_escaping(*iptr)) {
      char out[3]={'%'};
      out[1] = hexdigits[*iptr>>4];
      out[2] = hexdigits[*iptr & 0xf];
      result = Curl_dyn_addn(o, out, 3);
    }
    else
      result = Curl_dyn_addn(o, iptr, 1);
    if(result)
      return cc2cu(result);
  }

  return CURLUE_OK;
}